

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_NopointerSerialization_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_NopointerSerialization_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  key_type kVar4;
  key_type kVar5;
  key_type kVar6;
  value_type vVar7;
  key_type kVar8;
  Type type;
  FILE *actual_predicate_value;
  AssertHelper *this_00;
  char *message;
  AssertionResult *this_01;
  long in_RDI;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  TypeParam ht_in;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FILE *fp;
  int i;
  TypeParam ht_out;
  undefined4 in_stack_fffffffffffffaa8;
  int in_stack_fffffffffffffaac;
  HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffabc;
  char *in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac8;
  int in_stack_fffffffffffffacc;
  allocator_type *in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad8;
  Type in_stack_fffffffffffffadc;
  hasher *in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaec;
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffb10;
  undefined2 in_stack_fffffffffffffb14;
  undefined1 in_stack_fffffffffffffb16;
  undefined1 in_stack_fffffffffffffb17;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb28;
  value_type in_stack_fffffffffffffb2c;
  uint i_00;
  string local_4a0 [48];
  key_type local_470;
  undefined1 local_469;
  AssertionResult local_468;
  string local_458 [48];
  key_type local_428;
  undefined1 local_421;
  AssertionResult local_420 [2];
  key_type local_3fc;
  dense_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_3f8;
  Type local_3d4;
  AssertionResult local_3d0;
  string local_3c0 [48];
  key_type local_390;
  undefined1 local_389;
  AssertionResult local_388 [2];
  key_type local_364;
  dense_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_360;
  value_type local_33c;
  AssertionResult local_338 [2];
  key_type local_314;
  dense_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_310;
  value_type local_2ec;
  AssertionResult local_2e8;
  string local_2d8 [55];
  undefined1 local_2a1;
  AssertionResult local_2a0;
  string local_290 [55];
  undefined1 local_259;
  AssertionResult local_258;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_248;
  Hasher local_238;
  Hasher local_22c;
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_220;
  string local_198 [55];
  undefined1 local_161;
  AssertionResult local_160;
  string local_150 [55];
  undefined1 local_119;
  AssertionResult local_118;
  FILE *local_108;
  key_type local_100;
  key_type local_fc;
  value_type local_d0;
  int local_cc;
  key_type local_c8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b8;
  Hasher local_a8;
  Hasher local_9c;
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_90;
  
  bVar1 = google::
          HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    i_00 = 0;
    Hasher::Hasher(&local_9c,0);
    Hasher::Hasher(&local_a8,i_00);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_b8,i_00,(int *)(ulong)i_00);
    google::
    HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashtable
              ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)in_stack_fffffffffffffaf0,
               CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               in_stack_fffffffffffffae0,
               (key_equal *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
               in_stack_fffffffffffffad0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_b8);
    kVar4 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
    local_c8 = kVar4;
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffab0,
                      (key_type *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    for (local_cc = 1; local_cc < 100; local_cc = local_cc + 1) {
      in_stack_fffffffffffffb2c =
           HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
      local_d0 = in_stack_fffffffffffffb2c;
      google::
      BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)CONCAT44(i_00,kVar4),
               (value_type *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    }
    kVar5 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
    local_fc = kVar5;
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffffab0,
            (key_type *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    kVar6 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
    local_100 = kVar6;
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffffab0,
            (key_type *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    actual_predicate_value = tmpfile();
    local_119 = actual_predicate_value != (FILE *)0x0;
    local_108 = actual_predicate_value;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffab0,
               (bool *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
               (type *)0xf67153);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffae0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb2c,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffb20),(char *)actual_predicate_value,
                 (char *)CONCAT17(in_stack_fffffffffffffb17,
                                  CONCAT16(in_stack_fffffffffffffb16,
                                           CONCAT24(in_stack_fffffffffffffb14,
                                                    in_stack_fffffffffffffb10))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,
                 (char *)in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,
                 in_stack_fffffffffffffac0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffb2c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffab0);
      std::__cxx11::string::~string(local_150);
      testing::Message::~Message((Message *)0xf67216);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf672aa);
    uVar2 = google::
            BaseHashtableInterface<google::dense_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::serialize<google::sparsehash_internal::pod_serializer<int>,_IO_FILE>
                      (&local_90,local_108);
    local_161 = uVar2;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffab0,
               (bool *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
               (type *)0xf672eb);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_160);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffae0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb2c,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffb20),(char *)actual_predicate_value,
                 (char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffb16,
                                                 CONCAT24(in_stack_fffffffffffffb14,
                                                          in_stack_fffffffffffffb10))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,
                 (char *)in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,
                 in_stack_fffffffffffffac0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffb2c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffab0);
      std::__cxx11::string::~string(local_198);
      testing::Message::~Message((Message *)0xf673c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf67457);
    rewind(local_108);
    Hasher::Hasher(&local_22c,0);
    Hasher::Hasher(&local_238,0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_248,0,(int *)0x0);
    google::
    HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashtable
              ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)in_stack_fffffffffffffaf0,
               CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               in_stack_fffffffffffffae0,
               (key_equal *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
               in_stack_fffffffffffffad0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_248);
    local_259 = local_108 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffab0,
               (bool *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
               (type *)0xf674ff);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_258);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffae0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb2c,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffb20),(char *)actual_predicate_value,
                 (char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffb16,
                                                 CONCAT24(in_stack_fffffffffffffb14,
                                                          in_stack_fffffffffffffb10))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,
                 (char *)in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,
                 in_stack_fffffffffffffac0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffb2c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffab0);
      std::__cxx11::string::~string(local_290);
      testing::Message::~Message((Message *)0xf67613);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf676a7);
    uVar3 = google::
            BaseHashtableInterface<google::dense_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::unserialize<google::sparsehash_internal::pod_serializer<int>,_IO_FILE>
                      (&local_220,local_108);
    local_2a1 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffab0,
               (bool *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
               (type *)0xf676e8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffae0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb2c,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffb20),(char *)actual_predicate_value,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffb14,
                                                                in_stack_fffffffffffffb10))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,
                 (char *)in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,
                 in_stack_fffffffffffffac0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffb2c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffab0);
      std::__cxx11::string::~string(local_2d8);
      testing::Message::~Message((Message *)0xf677bd);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf67854);
    fclose(local_108);
    vVar7 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
    local_2ec = vVar7;
    local_314 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffaf0,
           (key_type *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    google::
    dense_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_310);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
               in_stack_fffffffffffffac0,
               (int *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
               (int *)in_stack_fffffffffffffab0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffae0);
      testing::AssertionResult::failure_message((AssertionResult *)0xf67943);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,
                 (char *)in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,
                 in_stack_fffffffffffffac0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffb2c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffab0);
      testing::Message::~Message((Message *)0xf679a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf67a11);
    local_33c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
    local_364 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffaf0,
           (key_type *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    google::
    dense_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_360);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
               in_stack_fffffffffffffac0,
               (int *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
               (int *)in_stack_fffffffffffffab0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_338);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffae0);
      in_stack_fffffffffffffaf0 =
           (BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xf67af1);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,
                 (char *)in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,
                 in_stack_fffffffffffffac0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffb2c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffab0);
      testing::Message::~Message((Message *)0xf67b4e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf67bbf);
    kVar8 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
    local_390 = kVar8;
    this_00 = (AssertHelper *)
              google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffab0,
                      (key_type *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    local_389 = this_00 == (AssertHelper *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffab0,
               (bool *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
               (type *)0xf67c27);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_388);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb2c,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffb20),(char *)actual_predicate_value,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffb14,vVar7))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,in_stack_fffffffffffffadc,(char *)in_stack_fffffffffffffad0,
                 in_stack_fffffffffffffacc,in_stack_fffffffffffffac0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffb2c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffab0);
      std::__cxx11::string::~string(local_3c0);
      testing::Message::~Message((Message *)0xf67cfc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf67d93);
    type = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
    local_3d4 = type;
    local_3fc = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffaf0,(key_type *)CONCAT44(kVar8,in_stack_fffffffffffffae8));
    google::
    dense_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_3f8);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
               in_stack_fffffffffffffac0,
               (int *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
               (int *)in_stack_fffffffffffffab0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3d0);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffad0 =
           (allocator_type *)testing::AssertionResult::failure_message((AssertionResult *)0xf67e73);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,
                 in_stack_fffffffffffffac0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffb2c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffab0);
      testing::Message::~Message((Message *)0xf67ed0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf67f41);
    kVar8 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
    local_428 = kVar8;
    message = (char *)google::
                      BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)in_stack_fffffffffffffab0,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    local_421 = message == (char *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffab0,
               (bool *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
               (type *)0xf67fa9);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_420);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb2c,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffb20),(char *)actual_predicate_value,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffb14,vVar7))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffffad0,kVar8,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffb2c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffab0);
      std::__cxx11::string::~string(local_458);
      testing::Message::~Message((Message *)0xf6807e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf68115);
    local_470 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
    this_01 = (AssertionResult *)
              google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffab0,
                      (key_type *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    local_469 = this_01 == (AssertionResult *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              (this_01,(bool *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
               (type *)0xf6817d);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_468);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb2c,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffb20),(char *)actual_predicate_value,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffb14,vVar7))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffffad0,kVar8,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffb2c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
      std::__cxx11::string::~string(local_4a0);
      testing::Message::~Message((Message *)0xf68252);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf682e6);
    google::
    HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashtable
              ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf682f3);
    google::
    HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashtable
              ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf68300);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, NopointerSerialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(typename TypeParam::NopointerSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(typename TypeParam::NopointerSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}